

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O1

void llbuild::buildsystem::BuildSystemInvocation::getUsage(int optionWidth,raw_ostream *os)

{
  long lVar1;
  raw_ostream *prVar2;
  long lVar3;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  Options options [11];
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  format_object_base local_1b8;
  undefined1 *local_1a8;
  int local_1a0 [2];
  char *local_198;
  long local_190;
  char *local_188;
  size_t local_180;
  char *local_178;
  undefined8 local_170;
  char *local_168;
  undefined8 local_160;
  char *local_158;
  undefined8 local_150;
  char *local_148;
  undefined8 local_140;
  char *local_138;
  undefined8 local_130;
  char *local_128;
  undefined8 local_120;
  char *local_118;
  undefined8 local_110;
  char *local_108;
  undefined8 local_100;
  char *local_f8;
  undefined8 local_f0;
  char *local_e8;
  undefined8 local_e0;
  char *local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  
  local_198 = "--help";
  local_190 = 6;
  local_188 = "show this help message and exit";
  local_180 = 0x1f;
  local_178 = "--version";
  local_170 = 9;
  local_168 = "show the tool version";
  local_160 = 0x15;
  local_158 = "-C <PATH>, --chdir <PATH>";
  local_150 = 0x19;
  local_148 = "change directory to PATH before building";
  local_140 = 0x28;
  local_138 = "--no-db";
  local_130 = 7;
  local_128 = "disable use of a build database";
  local_120 = 0x1f;
  local_118 = "--db <PATH>";
  local_110 = 0xb;
  local_108 = "enable building against the database at PATH";
  local_100 = 0x2c;
  local_f8 = "-f <PATH>";
  local_f0 = 9;
  local_e8 = "load the build task file at PATH";
  local_e0 = 0x20;
  local_d8 = "--serial";
  local_d0 = 8;
  local_c8 = "do not build in parallel";
  local_c0 = 0x18;
  local_b8 = "--scheduler <SCHEDULER>";
  local_b0 = 0x17;
  local_a8 = "set scheduler algorithm";
  local_a0 = 0x17;
  local_98 = "-j,--jobs <JOBS>";
  local_90 = 0x10;
  local_88 = "set how many concurrent jobs (lanes) to run";
  local_80 = 0x2b;
  local_78 = "-v, --verbose";
  local_70 = 0xd;
  local_68 = "show verbose status information";
  local_60 = 0x1f;
  local_58 = "--trace <PATH>";
  local_50 = 0xe;
  local_48 = "trace build engine operation to PATH";
  local_40 = 0x24;
  lVar3 = 0x18;
  do {
    Str.Length = 2;
    Str.Data = "  ";
    prVar2 = llvm::raw_ostream::operator<<(os,Str);
    lVar1 = *(long *)((long)&local_1b8.Fmt + lVar3);
    local_1d8 = &local_1c8;
    if (lVar1 == 0) {
      local_1d0 = 0;
      local_1c8 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,lVar1,*(long *)((long)local_1a0 + lVar3 + -8) + lVar1);
    }
    local_1b8.Fmt = "%-*s";
    local_1b8._vptr_format_object_base = (_func_int **)&PTR_home_0023f9c8;
    local_1a8 = local_1d8;
    local_1a0[0] = optionWidth;
    prVar2 = llvm::raw_ostream::operator<<(prVar2,&local_1b8);
    Str_00.Length = 1;
    Str_00.Data = " ";
    prVar2 = llvm::raw_ostream::operator<<(prVar2,Str_00);
    Str_01.Length = *(size_t *)((long)&local_198 + lVar3);
    Str_01.Data = *(char **)((long)local_1a0 + lVar3);
    prVar2 = llvm::raw_ostream::operator<<(prVar2,Str_01);
    Str_02.Length = 1;
    Str_02.Data = "\n";
    llvm::raw_ostream::operator<<(prVar2,Str_02);
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x178);
  return;
}

Assistant:

void BuildSystemInvocation::getUsage(int optionWidth, raw_ostream& os) {
  const struct Options {
    llvm::StringRef option, helpText;
  } options[] = {
    { "--help", "show this help message and exit" },
    { "--version", "show the tool version" },
    { "-C <PATH>, --chdir <PATH>", "change directory to PATH before building" },
    { "--no-db", "disable use of a build database" },
    { "--db <PATH>", "enable building against the database at PATH" },
    { "-f <PATH>", "load the build task file at PATH" },
    { "--serial", "do not build in parallel" },
    { "--scheduler <SCHEDULER>", "set scheduler algorithm" },
    { "-j,--jobs <JOBS>", "set how many concurrent jobs (lanes) to run" },
    { "-v, --verbose", "show verbose status information" },
    { "--trace <PATH>", "trace build engine operation to PATH" },
  };
  
  for (const auto& entry: options) {
    os << "  " << llvm::format("%-*s", optionWidth, entry.option.str().c_str()) << " "
       << entry.helpText << "\n";
  }
}